

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac.c
# Opt level: O1

void pac_decay_to_limit(tsdn_t *tsdn,pac_t *pac,decay_t *decay,pac_decay_stats_t *decay_stats,
                       ecache_t *ecache,_Bool fully_decay,size_t npages_limit,
                       size_t npages_decay_max)

{
  pthread_mutex_t *__mutex;
  atomic_zu_t *paVar1;
  uint64_t *puVar2;
  witness_t **ppwVar3;
  edata_t *peVar4;
  _Bool _Var5;
  int iVar6;
  ehooks_t *peVar7;
  edata_t *peVar8;
  mutex_prof_data_t *data;
  long lVar9;
  ulong uVar10;
  edata_t *edata;
  long lVar11;
  bool bVar12;
  long local_68;
  
  if ((npages_decay_max != 0) && (decay->purging == false)) {
    decay->purging = true;
    (decay->mtx).field_0.field_0.locked.repr = false;
    __mutex = (pthread_mutex_t *)((long)&(decay->mtx).field_0 + 0x48);
    pthread_mutex_unlock(__mutex);
    peVar7 = duckdb_je_base_ehooks_get(pac->base);
    edata = (edata_t *)0x0;
    uVar10 = 0;
    do {
      if (npages_decay_max <= uVar10) break;
      peVar8 = duckdb_je_ecache_evict(tsdn,pac,peVar7,ecache,npages_limit);
      if (peVar8 != (edata_t *)0x0) {
        (peVar8->field_6).ql_link_inactive.qre_next = peVar8;
        (peVar8->field_6).ql_link_inactive.qre_prev = peVar8;
        if (edata != (edata_t *)0x0) {
          (peVar8->field_6).ql_link_inactive.qre_next = (edata->field_6).ql_link_inactive.qre_prev;
          (edata->field_6).ql_link_inactive.qre_prev = peVar8;
          (peVar8->field_6).ql_link_inactive.qre_prev =
               (((peVar8->field_6).ql_link_inactive.qre_prev)->field_6).ql_link_inactive.qre_next;
          (((edata->field_6).ql_link_inactive.qre_prev)->field_6).ql_link_inactive.qre_next = edata;
          (((peVar8->field_6).ql_link_inactive.qre_prev)->field_6).ql_link_inactive.qre_next =
               peVar8;
        }
        edata = (peVar8->field_6).ql_link_inactive.qre_next;
        uVar10 = uVar10 + ((peVar8->field_2).e_size_esn >> 0xc);
      }
    } while (peVar8 != (edata_t *)0x0);
    if (uVar10 != 0) {
      peVar7 = duckdb_je_base_ehooks_get(pac->base);
      bVar12 = true;
      if (!fully_decay) {
        bVar12 = (pac->decay_muzzy).time_ms.repr == 0;
      }
      if (edata == (edata_t *)0x0) {
        lVar9 = 0;
        local_68 = 0;
        lVar11 = 0;
      }
      else {
        lVar11 = 0;
        local_68 = 0;
        lVar9 = 0;
        do {
          peVar8 = (edata->field_6).ql_link_inactive.qre_next;
          if (peVar8 == edata) {
            peVar8 = (edata_t *)0x0;
          }
          else {
            (((edata->field_6).ql_link_inactive.qre_prev)->field_6).ql_link_inactive.qre_next =
                 (((edata->field_6).ql_link_inactive.qre_next)->field_6).ql_link_inactive.qre_prev;
            (((edata->field_6).ql_link_inactive.qre_next)->field_6).ql_link_inactive.qre_prev =
                 (edata->field_6).ql_link_inactive.qre_prev;
            peVar4 = (edata->field_6).ql_link_inactive.qre_next;
            (edata->field_6).ql_link_inactive.qre_prev =
                 (((edata->field_6).ql_link_inactive.qre_prev)->field_6).ql_link_inactive.qre_next;
            (((peVar4->field_6).ql_link_inactive.qre_prev)->field_6).ql_link_inactive.qre_next =
                 peVar4;
            (((edata->field_6).ql_link_inactive.qre_prev)->field_6).ql_link_inactive.qre_next =
                 edata;
          }
          uVar10 = (edata->field_2).e_size_esn >> 0xc;
          if (ecache->state != extent_state_dirty || bVar12) {
LAB_01db5c5b:
            duckdb_je_extent_dalloc_wrapper(tsdn,pac,peVar7,edata);
            local_68 = local_68 + uVar10;
          }
          else {
            _Var5 = duckdb_je_extent_purge_lazy_wrapper
                              (tsdn,peVar7,edata,0,(edata->field_2).e_size_esn & 0xfffffffffffff000)
            ;
            if (_Var5) goto LAB_01db5c5b;
            duckdb_je_ecache_dalloc(tsdn,pac,peVar7,&pac->ecache_muzzy,edata);
          }
          lVar9 = lVar9 + uVar10;
          lVar11 = lVar11 + 1;
          edata = peVar8;
        } while (peVar8 != (edata_t *)0x0);
        local_68 = local_68 << 0xc;
      }
      LOCK();
      (decay_stats->npurge).val.repr = (decay_stats->npurge).val.repr + 1;
      UNLOCK();
      LOCK();
      (decay_stats->nmadvise).val.repr = (decay_stats->nmadvise).val.repr + lVar11;
      UNLOCK();
      LOCK();
      (decay_stats->purged).val.repr = (decay_stats->purged).val.repr + lVar9;
      UNLOCK();
      LOCK();
      paVar1 = &pac->stats->pac_mapped;
      paVar1->repr = paVar1->repr - local_68;
      UNLOCK();
    }
    iVar6 = pthread_mutex_trylock(__mutex);
    if (iVar6 != 0) {
      duckdb_je_malloc_mutex_lock_slow(&decay->mtx);
      (decay->mtx).field_0.field_0.locked.repr = true;
    }
    puVar2 = &(decay->mtx).field_0.field_0.prof_data.n_lock_ops;
    *puVar2 = *puVar2 + 1;
    if ((decay->mtx).field_0.field_0.prof_data.prev_owner != tsdn) {
      (decay->mtx).field_0.field_0.prof_data.prev_owner = tsdn;
      ppwVar3 = &(decay->mtx).field_0.witness.link.qre_prev;
      *ppwVar3 = (witness_t *)((long)&(*ppwVar3)->name + 1);
    }
    decay->purging = false;
  }
  return;
}

Assistant:

static void
pac_decay_to_limit(tsdn_t *tsdn, pac_t *pac, decay_t *decay,
    pac_decay_stats_t *decay_stats, ecache_t *ecache, bool fully_decay,
    size_t npages_limit, size_t npages_decay_max) {
	witness_assert_depth_to_rank(tsdn_witness_tsdp_get(tsdn),
	    WITNESS_RANK_CORE, 1);

	if (decay->purging || npages_decay_max == 0) {
		return;
	}
	decay->purging = true;
	malloc_mutex_unlock(tsdn, &decay->mtx);

	edata_list_inactive_t decay_extents;
	edata_list_inactive_init(&decay_extents);
	size_t npurge = pac_stash_decayed(tsdn, pac, ecache, npages_limit,
	    npages_decay_max, &decay_extents);
	if (npurge != 0) {
		size_t npurged = pac_decay_stashed(tsdn, pac, decay,
		    decay_stats, ecache, fully_decay, &decay_extents);
		assert(npurged == npurge);
	}

	malloc_mutex_lock(tsdn, &decay->mtx);
	decay->purging = false;
}